

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,char needle)

{
  qsizetype qVar1;
  uchar in_R8B;
  QByteArrayView haystack_00;
  
  haystack_00.m_size = haystack.m_data;
  haystack_00.m_data = (storage_type *)from;
  qVar1 = lastIndexOf((QtPrivate *)haystack.m_size,haystack_00,(ulong)(byte)needle,in_R8B);
  return qVar1;
}

Assistant:

Q_CORE_EXPORT qsizetype lastIndexOf(QByteArrayView haystack, qsizetype from, char needle) noexcept
{
    return lastIndexOf(haystack, from, uchar(needle));
}